

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O3

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,unsigned_short n)

{
  byte bVar1;
  byte *pbVar2;
  StringBuffer *pSVar3;
  ushort uVar4;
  byte *pbVar5;
  byte *__n;
  uint uVar6;
  byte *in_RDX;
  undefined6 in_register_00000032;
  ulong uVar7;
  bool bVar8;
  char fbuf [64];
  byte local_48 [72];
  
  uVar7 = CONCAT62(in_register_00000032,n);
  pbVar2 = local_48;
  __n = local_48;
  if ((int)uVar7 == 0) {
    pbVar2 = local_48 + 1;
    local_48[0] = 0x30;
  }
  else {
    do {
      uVar6 = ((uint)uVar7 & 0xffff) / 10;
      in_RDX = (byte *)(ulong)uVar6;
      *pbVar2 = (char)uVar7 + (char)uVar6 * -10 | 0x30;
      pbVar2 = pbVar2 + 1;
      uVar4 = (ushort)uVar7;
      uVar7 = (ulong)uVar6;
    } while (9 < uVar4);
  }
  *pbVar2 = 0;
  pbVar2 = pbVar2 + -1;
  if (local_48 < pbVar2) {
    pbVar5 = local_48 + 1;
    do {
      bVar1 = pbVar5[-1];
      pbVar5[-1] = *pbVar2;
      *pbVar2 = bVar1;
      pbVar2 = pbVar2 + -1;
      __n = pbVar5 + 1;
      bVar8 = pbVar5 < pbVar2;
      pbVar5 = __n;
      in_RDX = __n;
    } while (bVar8);
  }
  pSVar3 = (StringBuffer *)write(this,(int)local_48,in_RDX,(size_t)__n);
  return pSVar3;
}

Assistant:

StringBuffer& operator<<(unsigned short int n) { _UITOA(n); }